

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XAtlas_wrap.cxx
# Opt level: O1

void CSharp_XAtlasSharp_SetProgressCallback__SWIG_0(void *jarg1,void *jarg2,void *jarg3)

{
  if (jarg1 == (void *)0x0) {
    if (xatlas::internal::s_print != (undefined *)0x0) {
      (*(code *)xatlas::internal::s_print)("SetProgressCallback: atlas is null.\n");
      return;
    }
  }
  else {
    *(void **)((long)jarg1 + 0x90) = jarg2;
    *(void **)((long)jarg1 + 0x98) = jarg3;
  }
  return;
}

Assistant:

SWIGEXPORT void SWIGSTDCALL CSharp_XAtlasSharp_SetProgressCallback__SWIG_0(void * jarg1, void* jarg2, void * jarg3) {
  xatlas::Atlas *arg1 = (xatlas::Atlas *) 0 ;
  xatlas::ProgressFunc arg2 = (xatlas::ProgressFunc) 0 ;
  void *arg3 = (void *) 0 ;
  
  arg1 = (xatlas::Atlas *)jarg1; 
  arg2 = (xatlas::ProgressFunc)jarg2; 
  arg3 = (void *)jarg3; 
  xatlas::SetProgressCallback(arg1,arg2,arg3);
}